

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::Instruction::NumInOperandWords(Instruction *this)

{
  pointer pOVar1;
  uint uVar2;
  size_t sVar3;
  uint32_t uVar4;
  
  uVar2 = (this->has_result_id_ & 1) + 1;
  if (this->has_type_id_ == false) {
    uVar2 = (uint)this->has_result_id_;
  }
  uVar4 = 0;
  while( true ) {
    pOVar1 = (this->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1) / 0x30) <=
        (ulong)uVar2) break;
    sVar3 = utils::SmallVector<unsigned_int,_2UL>::size(&pOVar1[uVar2].words);
    uVar4 = uVar4 + (int)sVar3;
    uVar2 = uVar2 + 1;
  }
  return uVar4;
}

Assistant:

uint32_t Instruction::NumInOperandWords() const {
  uint32_t size = 0;
  for (uint32_t i = TypeResultIdCount(); i < operands_.size(); ++i)
    size += static_cast<uint32_t>(operands_[i].words.size());
  return size;
}